

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getDigits(char *zDate,char *zFormat,...)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  undefined8 *local_f0;
  undefined8 local_d8 [11];
  va_list ap;
  
  local_f0 = (undefined8 *)&stack0x00000008;
  uVar6 = 0x10;
  iVar3 = 0;
  while( true ) {
    bVar1 = *zFormat;
    bVar2 = ((byte *)zFormat)[3];
    if (bVar1 == 0x30) {
      iVar4 = 0;
      pbVar8 = (byte *)zDate;
    }
    else {
      pbVar8 = (byte *)zDate + (ulong)(bVar1 - 0x31 & 0xff) + 1;
      lVar9 = 0;
      iVar4 = 0;
      do {
        if ((ulong)((byte *)zDate)[lVar9] - 0x3a < 0xfffffffffffffff6) {
          return iVar3;
        }
        iVar4 = (int)(char)((byte *)zDate)[lVar9] + iVar4 * 10 + -0x30;
        lVar9 = lVar9 + 1;
      } while ((byte)(bVar1 - 0x30) != (char)lVar9);
    }
    if (iVar4 < (char)(((byte *)zFormat)[1] - 0x30)) {
      return iVar3;
    }
    if ((int)(uint)(ushort)yy_reduce_ofst[(long)(char)((byte *)zFormat)[2] + 0xef] < iVar4) {
      return iVar3;
    }
    if ((bVar2 != 0) && (bVar2 != *pbVar8)) break;
    uVar7 = (ulong)uVar6;
    if (uVar7 < 0x29) {
      uVar6 = uVar6 + 8;
      puVar5 = (undefined8 *)((long)local_d8 + uVar7);
    }
    else {
      puVar5 = local_f0;
      local_f0 = local_f0 + 1;
    }
    zDate = (char *)(pbVar8 + 1);
    iVar3 = iVar3 + 1;
    zFormat = (char *)((byte *)zFormat + 4);
    *(int *)*puVar5 = iVar4;
    if (bVar2 == 0) {
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e     f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 9999 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}